

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

char remap(symbol s)

{
  symbol s_local;
  char local_1;
  
  switch(s) {
  case '\0':
    local_1 = 'i';
    break;
  case '\x01':
    local_1 = 'm';
    break;
  case '\x02':
    local_1 = 'p';
    break;
  case '\x03':
    local_1 = 's';
    break;
  default:
    local_1 = 'X';
  }
  return local_1;
}

Assistant:

char remap(symbol s){

	switch(s){
		case 0: return 'i';
		case 1: return 'm';
		case 2: return 'p';
		case 3: return 's';
	}

	return 'X';

}